

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O2

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry *entry,QFileSystemMetaData *data)

{
  long in_FS_OFFSET;
  QFileSystemEntry copy;
  undefined1 local_88 [32];
  undefined1 local_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,(QFileSystemEntry *)data);
  QFileSystemEntry::filePath((QString *)(local_88 + 8),(QFileSystemEntry *)local_68);
  qt_custom_file_engine_handler_create((QString *)local_88);
  (entry->m_filePath).d.d = (Data *)local_88._0_8_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_88 + 8));
  QFileSystemEntry::operator=((QFileSystemEntry *)data,(QFileSystemEntry *)local_68);
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
            )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
              )entry;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QAbstractFileEngine>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    QFileSystemEntry copy = entry;
    std::unique_ptr<QAbstractFileEngine> engine;

    if (_q_createLegacyEngine_recursive(copy, data, engine))
        // Reset entry to resolved copy.
        entry = copy;
    else
        data.clear();

    return engine;
}